

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_restore(_binbuf *x,int argc,t_atom *argv)

{
  char **__s1;
  int iVar1;
  int iVar2;
  char *pcVar3;
  word local_478;
  word local_470;
  undefined4 local_460;
  int local_45c;
  int dollar_1;
  int dollsym;
  int slashed;
  int dollar;
  char *usestr;
  char *sp2;
  char *sp1;
  char buf [1000];
  char **local_48;
  char *str2;
  char *str;
  t_atom *ap;
  int i;
  int newsize;
  int previoussize;
  t_atom *argv_local;
  int argc_local;
  _binbuf *x_local;
  
  iVar2 = x->b_n;
  iVar1 = binbuf_resize(x,iVar2 + argc);
  if (iVar1 == 0) {
    pd_error((void *)0x0,"binbuf_restore: out of space");
  }
  else {
    str = (char *)(x->b_vec + iVar2);
    ap._4_4_ = argc;
    _newsize = argv;
    while (ap._4_4_ != 0) {
      if (_newsize->a_type == A_SYMBOL) {
        __s1 = (char **)((_newsize->a_w).w_symbol)->s_name;
        iVar2 = strcmp((char *)__s1,";");
        if (iVar2 == 0) {
          str[0] = '\x04';
          str[1] = '\0';
          str[2] = '\0';
          str[3] = '\0';
          str[8] = '\0';
          str[9] = '\0';
          str[10] = '\0';
          str[0xb] = '\0';
        }
        else {
          iVar2 = strcmp((char *)__s1,",");
          if (iVar2 == 0) {
            str[0] = '\x05';
            str[1] = '\0';
            str[2] = '\0';
            str[3] = '\0';
            str[8] = '\0';
            str[9] = '\0';
            str[10] = '\0';
            str[0xb] = '\0';
          }
          else {
            dollsym = 0;
            pcVar3 = strchr((char *)__s1,0x5c);
            _slashed = __s1;
            if (pcVar3 != (char *)0x0) {
              dollar_1 = 0;
              sp2 = (char *)&sp1;
              for (usestr = ((_newsize->a_w).w_symbol)->s_name; *usestr != '\0' && sp2 < buf + 0x3df
                  ; usestr = usestr + 1) {
                if (dollar_1 == 0) {
                  if (*usestr == '\\') {
                    dollar_1 = 1;
                  }
                  else {
                    if (((*usestr == '$') && ('/' < usestr[1])) && (usestr[1] < ':')) {
                      dollsym = 1;
                    }
                    *sp2 = *usestr;
                    dollar_1 = 0;
                    sp2 = sp2 + 1;
                  }
                }
                else {
                  *sp2 = *usestr;
                  dollar_1 = 0;
                  sp2 = sp2 + 1;
                }
              }
              *sp2 = '\0';
              _slashed = &sp1;
            }
            if ((dollsym == 0) &&
               (((_slashed != __s1 ||
                 (pcVar3 = strchr((char *)_slashed,0x24), pcVar3 == (char *)0x0)) ||
                ((pcVar3[1] < '0' || ('9' < pcVar3[1])))))) {
              str[0] = '\x02';
              str[1] = '\0';
              str[2] = '\0';
              str[3] = '\0';
              if (_slashed == __s1) {
                local_478 = _newsize->a_w;
              }
              else {
                local_478.w_symbol = gensym((char *)_slashed);
              }
              *(word *)(str + 8) = local_478;
            }
            else {
              local_45c = 0;
              local_48 = _slashed;
              if (*(char *)_slashed == '$') {
                do {
                  local_48 = (char **)((long)local_48 + 1);
                  if (*(char *)local_48 == '\0') goto LAB_00198c22;
                } while (('/' < *(char *)local_48) && (*(char *)local_48 < ':'));
                local_45c = 1;
              }
              else {
                local_45c = 1;
              }
LAB_00198c22:
              if (local_45c == 0) {
                local_460 = 0;
                __isoc99_sscanf((long)_slashed + 1,"%d",&local_460);
                str[0] = '\b';
                str[1] = '\0';
                str[2] = '\0';
                str[3] = '\0';
                *(undefined4 *)(str + 8) = local_460;
              }
              else {
                str[0] = '\t';
                str[1] = '\0';
                str[2] = '\0';
                str[3] = '\0';
                if (_slashed == __s1) {
                  local_470 = _newsize->a_w;
                }
                else {
                  local_470.w_symbol = gensym((char *)_slashed);
                }
                *(word *)(str + 8) = local_470;
              }
            }
          }
        }
      }
      else {
        *(undefined8 *)str = *(undefined8 *)_newsize;
        *(word *)(str + 8) = _newsize->a_w;
      }
      _newsize = _newsize + 1;
      str = str + 0x10;
      ap._4_4_ = ap._4_4_ + -1;
    }
  }
  return;
}

Assistant:

void binbuf_restore(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_restore: out of space");
        return;
    }

    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
    {
        if (argv->a_type == A_SYMBOL)
        {
            const char *str = argv->a_w.w_symbol->s_name, *str2;
            if (!strcmp(str, ";")) SETSEMI(ap);
            else if (!strcmp(str, ",")) SETCOMMA(ap);
            else
            {
                char buf[MAXPDSTRING], *sp1;
                const char *sp2, *usestr;
                int dollar = 0;
                if (strchr(str, '\\'))
                {
                    int slashed = 0;
                    for (sp1 = buf, sp2 = argv->a_w.w_symbol->s_name;
                        *sp2 && sp1 < buf + (MAXPDSTRING-1);
                            sp2++)
                    {
                        if (slashed)
                            *sp1++ = *sp2, slashed = 0;
                        else if (*sp2 == '\\')
                            slashed = 1;
                        else
                        {
                            if (*sp2 == '$' && sp2[1] >= '0' && sp2[1] <= '9')
                                dollar = 1;
                            *sp1++ = *sp2;
                            slashed = 0;
                        }
                    }
                    *sp1 = 0;
                    usestr = buf;
                }
                else usestr = str;
                if (dollar || (usestr== str && (str2 = strchr(usestr, '$')) &&
                    str2[1] >= '0' && str2[1] <= '9'))
                {
                    int dollsym = 0;
                    if (*usestr != '$')
                        dollsym = 1;
                    else for (str2 = usestr + 1; *str2; str2++)
                        if (*str2 < '0' || *str2 > '9')
                    {
                        dollsym = 1;
                        break;
                    }
                    if (dollsym)
                        SETDOLLSYM(ap, usestr == str ?
                            argv->a_w.w_symbol : gensym(usestr));
                    else
                    {
                        int dollar = 0;
                        sscanf(usestr + 1, "%d", &dollar);
                        SETDOLLAR(ap, dollar);
                    }
                }
                else SETSYMBOL(ap, usestr == str ?
                    argv->a_w.w_symbol : gensym(usestr));
                /* fprintf(stderr, "arg %s -> binbuf %s type %d\n",
                    argv->a_w.w_symbol->s_name, usestr, ap->a_type); */
            }
            argv++;
        }
        else *ap = *(argv++);
    }
}